

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O3

void duckdb::TemplatedFetchCommitted<unsigned_short>(UpdateInfo *info,Vector *result)

{
  uint uVar1;
  data_ptr_t __dest;
  ulong uVar2;
  ulong uVar3;
  
  __dest = result->data;
  uVar2 = (ulong)info->N;
  uVar1 = info->max;
  if (uVar2 == 0x800) {
    switchD_012b9b0d::default(__dest,(void *)((long)&info[1].segment + (ulong)uVar1 * 4),0x1000);
    return;
  }
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      *(undefined2 *)(__dest + (ulong)*(uint *)((long)&info[1].segment + uVar3 * 4) * 2) =
           *(undefined2 *)((long)&info[1].segment + uVar3 * 2 + (ulong)uVar1 * 4);
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  return;
}

Assistant:

static void TemplatedFetchCommitted(UpdateInfo &info, Vector &result) {
	auto result_data = FlatVector::GetData<T>(result);
	MergeUpdateInfo<T>(info, result_data);
}